

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O1

void append_entry_w(wchar_t **wp,wchar_t *prefix,wchar_t tag,wchar_t *wname,wchar_t perm,wchar_t id)

{
  size_t sVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  int *__src;
  wchar_t *pwVar4;
  
  if (prefix != (wchar_t *)0x0) {
    wcscpy(*wp,prefix);
    pwVar4 = *wp;
    sVar1 = wcslen(pwVar4);
    *wp = pwVar4 + sVar1;
  }
  __src = anon_var_dwarf_f36757;
  switch(tag) {
  case L'✑':
    goto switchD_00480fed_caseD_2711;
  case L'✒':
    break;
  case L'✓':
    __src = anon_var_dwarf_f3676e;
    goto switchD_00480fed_caseD_2711;
  case L'✔':
    __src = anon_var_dwarf_f3676e;
    break;
  case L'✕':
    __src = anon_var_dwarf_f36790;
    break;
  case L'✖':
    __src = anon_var_dwarf_f36785;
    break;
  default:
    goto switchD_00480fed_default;
  }
  id = L'\xffffffff';
  wname = (wchar_t *)0x0;
switchD_00480fed_caseD_2711:
  wcscpy(*wp,__src);
switchD_00480fed_default:
  pwVar4 = *wp;
  sVar1 = wcslen(pwVar4);
  pwVar4 = pwVar4 + sVar1 + 1;
  *wp = pwVar4;
  pwVar4[-1] = L':';
  if (wname == (wchar_t *)0x0) {
    if ((tag & 0xfffffffdU) == 0x2711) {
      append_id_w(wp,id);
      id = L'\xffffffff';
    }
  }
  else {
    wcscpy(pwVar4,wname);
    pwVar4 = *wp;
    sVar1 = wcslen(pwVar4);
    *wp = pwVar4 + sVar1;
  }
  pwVar4 = *wp;
  *wp = pwVar4 + 1;
  *pwVar4 = L':';
  wVar2 = L'r';
  if ((perm & 0x124U) == 0) {
    wVar2 = L'-';
  }
  *wp = pwVar4 + 2;
  wVar3 = L'w';
  if ((perm & 0x92U) == 0) {
    wVar3 = L'-';
  }
  pwVar4[1] = wVar2;
  *wp = pwVar4 + 3;
  pwVar4[2] = wVar3;
  wVar2 = L'x';
  if ((perm & 0x49U) == 0) {
    wVar2 = L'-';
  }
  *wp = pwVar4 + 4;
  pwVar4[3] = wVar2;
  if (id != L'\xffffffff') {
    *wp = pwVar4 + 5;
    pwVar4[4] = L':';
    append_id_w(wp,id);
  }
  **wp = L'\0';
  return;
}

Assistant:

static void
append_entry_w(wchar_t **wp, const wchar_t *prefix, int tag,
    const wchar_t *wname, int perm, int id)
{
	if (prefix != NULL) {
		wcscpy(*wp, prefix);
		*wp += wcslen(*wp);
	}
	switch (tag) {
	case ARCHIVE_ENTRY_ACL_USER_OBJ:
		wname = NULL;
		id = -1;
		/* FALLTHROUGH */
	case ARCHIVE_ENTRY_ACL_USER:
		wcscpy(*wp, L"user");
		break;
	case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
		wname = NULL;
		id = -1;
		/* FALLTHROUGH */
	case ARCHIVE_ENTRY_ACL_GROUP:
		wcscpy(*wp, L"group");
		break;
	case ARCHIVE_ENTRY_ACL_MASK:
		wcscpy(*wp, L"mask");
		wname = NULL;
		id = -1;
		break;
	case ARCHIVE_ENTRY_ACL_OTHER:
		wcscpy(*wp, L"other");
		wname = NULL;
		id = -1;
		break;
	}
	*wp += wcslen(*wp);
	*(*wp)++ = L':';
	if (wname != NULL) {
		wcscpy(*wp, wname);
		*wp += wcslen(*wp);
	} else if (tag == ARCHIVE_ENTRY_ACL_USER
	    || tag == ARCHIVE_ENTRY_ACL_GROUP) {
		append_id_w(wp, id);
		id = -1;
	}
	*(*wp)++ = L':';
	*(*wp)++ = (perm & 0444) ? L'r' : L'-';
	*(*wp)++ = (perm & 0222) ? L'w' : L'-';
	*(*wp)++ = (perm & 0111) ? L'x' : L'-';
	if (id != -1) {
		*(*wp)++ = L':';
		append_id_w(wp, id);
	}
	**wp = L'\0';
}